

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int blobSeekToRow(Incrblob *p,sqlite3_int64 iRow,char **pzErr)

{
  uint uVar1;
  sqlite3_stmt *psVar2;
  long *plVar3;
  BtCursor *pBVar4;
  sqlite3 *db;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  
  psVar2 = p->pStmt;
  *(sqlite3_int64 *)(*(long *)(psVar2 + 0x78) + 0x18) = iRow;
  iVar5 = sqlite3_step(p->pStmt);
  pcVar7 = (char *)0x0;
  if (iVar5 == 100) {
    plVar3 = (long *)**(long **)(psVar2 + 0x70);
    uVar1 = *(uint *)(plVar3[0xe] + (long)p->iCol * 4);
    if (uVar1 < 0xc) {
      pcVar7 = "integer";
      if (uVar1 == 7) {
        pcVar7 = "real";
      }
      pcVar6 = "null";
      if (uVar1 != 0) {
        pcVar6 = pcVar7;
      }
      pcVar7 = sqlite3MPrintf(p->db,"cannot open value of type %s",pcVar6);
      sqlite3_finalize(p->pStmt);
      p->pStmt = (sqlite3_stmt *)0x0;
      iVar5 = 1;
    }
    else {
      p->iOffset = *(int *)(plVar3[0xf] + (long)p->iCol * 4);
      p->nByte = uVar1 - 0xc >> 1;
      pBVar4 = (BtCursor *)*plVar3;
      p->pCsr = pBVar4;
      sqlite3BtreeEnter(pBVar4->pBtree);
      pBVar4 = p->pCsr;
      sqlite3_free(pBVar4->aOverflow);
      pBVar4->aOverflow = (Pgno *)0x0;
      pBVar4->isIncrblobHandle = '\x01';
      sqlite3BtreeLeaveCursor(p->pCsr);
      iVar5 = 100;
      pcVar7 = (char *)0x0;
    }
  }
  if (iVar5 == 100) {
    iVar5 = 0;
  }
  else if (p->pStmt != (sqlite3_stmt *)0x0) {
    iVar5 = sqlite3_finalize(p->pStmt);
    p->pStmt = (sqlite3_stmt *)0x0;
    db = p->db;
    if (iVar5 == 0) {
      pcVar7 = sqlite3MPrintf(db,"no such rowid: %lld",iRow);
      iVar5 = 1;
    }
    else {
      pcVar7 = sqlite3_errmsg(db);
      pcVar7 = sqlite3MPrintf(db,"%s",pcVar7);
    }
  }
  *pzErr = pcVar7;
  return iVar5;
}

Assistant:

static int blobSeekToRow(Incrblob *p, sqlite3_int64 iRow, char **pzErr){
  int rc;                         /* Error code */
  char *zErr = 0;                 /* Error message */
  Vdbe *v = (Vdbe *)p->pStmt;

  /* Set the value of the SQL statements only variable to integer iRow. 
  ** This is done directly instead of using sqlite3_bind_int64() to avoid 
  ** triggering asserts related to mutexes.
  */
  assert( v->aVar[0].flags&MEM_Int );
  v->aVar[0].u.i = iRow;

  rc = sqlite3_step(p->pStmt);
  if( rc==SQLITE_ROW ){
    u32 type = v->apCsr[0]->aType[p->iCol];
    if( type<12 ){
      zErr = sqlite3MPrintf(p->db, "cannot open value of type %s",
          type==0?"null": type==7?"real": "integer"
      );
      rc = SQLITE_ERROR;
      sqlite3_finalize(p->pStmt);
      p->pStmt = 0;
    }else{
      p->iOffset = v->apCsr[0]->aOffset[p->iCol];
      p->nByte = sqlite3VdbeSerialTypeLen(type);
      p->pCsr =  v->apCsr[0]->pCursor;
      sqlite3BtreeEnterCursor(p->pCsr);
      sqlite3BtreeCacheOverflow(p->pCsr);
      sqlite3BtreeLeaveCursor(p->pCsr);
    }
  }

  if( rc==SQLITE_ROW ){
    rc = SQLITE_OK;
  }else if( p->pStmt ){
    rc = sqlite3_finalize(p->pStmt);
    p->pStmt = 0;
    if( rc==SQLITE_OK ){
      zErr = sqlite3MPrintf(p->db, "no such rowid: %lld", iRow);
      rc = SQLITE_ERROR;
    }else{
      zErr = sqlite3MPrintf(p->db, "%s", sqlite3_errmsg(p->db));
    }
  }

  assert( rc!=SQLITE_OK || zErr==0 );
  assert( rc!=SQLITE_ROW && rc!=SQLITE_DONE );

  *pzErr = zErr;
  return rc;
}